

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O3

void __thiscall irr::video::CImage::setPixel(CImage *this,u32 x,u32 y,SColor *color,bool blend)

{
  ECOLOR_FORMAT EVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  u8 *puVar8;
  int iVar9;
  double in_XMM0_Qa;
  
  if ((x < (this->super_IImage).Size.Width) && (y < (this->super_IImage).Size.Height)) {
    EVar1 = (this->super_IImage).Format;
    switch(EVar1) {
    case ECF_A1R5G5B5:
      puVar8 = (this->super_IImage).Data + y * (this->super_IImage).Pitch;
      uVar7 = color->color;
      uVar4 = (ushort)(uVar7 >> 3) & 0x1f |
              (ushort)(uVar7 >> 6) & 0x3e0 |
              (ushort)(uVar7 >> 9) & 0x7c00 | (ushort)(uVar7 >> 0x10) & 0x8000;
      break;
    case ECF_R5G6B5:
      puVar8 = (this->super_IImage).Data + y * (this->super_IImage).Pitch;
      uVar7 = color->color;
      uVar4 = (ushort)(uVar7 >> 3) & 0x1f |
              (ushort)(uVar7 >> 5) & 0x7e0 | (ushort)(uVar7 >> 8) & 0xf800;
      break;
    case ECF_R8G8B8:
      uVar7 = y * (this->super_IImage).Pitch;
      puVar8 = (this->super_IImage).Data;
      uVar5 = (ulong)(x * 3);
      puVar8[uVar5 + uVar7] = *(u8 *)((long)&color->color + 2);
      puVar8[uVar5 + 1 + (ulong)uVar7] = *(u8 *)((long)&color->color + 1);
      puVar8[uVar5 + 2 + (ulong)uVar7] = (u8)color->color;
      return;
    case ECF_A8R8G8B8:
      uVar7 = y * (this->super_IImage).Pitch;
      puVar8 = (this->super_IImage).Data;
      if (blend) {
        uVar2 = *(uint *)(puVar8 + (ulong)(x << 2) + (ulong)uVar7);
        uVar3 = color->color;
        uVar6 = uVar2;
        if (((uVar3 & 0xff000000) != 0) && (uVar6 = uVar3, uVar3 < 0xff000000)) {
          iVar9 = (uVar3 >> 0x18) - ((int)uVar3 >> 0x1f);
          uVar6 = (((uVar3 & 0xff00) - (uVar2 & 0xff00)) * iVar9 >> 8) + (uVar2 & 0xff00) & 0xff00 |
                  (((uVar3 & 0xff00ff) - (uVar2 & 0xff00ff)) * iVar9 >> 8) + (uVar2 & 0xff00ff) &
                  0xff00ff | uVar3 & 0xff000000;
        }
      }
      else {
        uVar6 = color->color;
      }
      *(uint *)(puVar8 + (ulong)(x << 2) + (ulong)uVar7) = uVar6;
      return;
    default:
      if (EVar1 != ECF_UNKNOWN) {
        return;
      }
      os::Printer::log((Printer *)"IImage::setPixel unknown format.",in_XMM0_Qa);
      return;
    }
    *(ushort *)(puVar8 + x * 2) = uVar4;
  }
  return;
}

Assistant:

void CImage::setPixel(u32 x, u32 y, const SColor &color, bool blend)
{
	if (x >= Size.Width || y >= Size.Height)
		return;

	switch (Format) {
	case ECF_A1R5G5B5: {
		u16 *dest = (u16 *)(Data + (y * Pitch) + (x << 1));
		*dest = video::A8R8G8B8toA1R5G5B5(color.color);
	} break;

	case ECF_R5G6B5: {
		u16 *dest = (u16 *)(Data + (y * Pitch) + (x << 1));
		*dest = video::A8R8G8B8toR5G6B5(color.color);
	} break;

	case ECF_R8G8B8: {
		u8 *dest = Data + (y * Pitch) + (x * 3);
		dest[0] = (u8)color.getRed();
		dest[1] = (u8)color.getGreen();
		dest[2] = (u8)color.getBlue();
	} break;

	case ECF_A8R8G8B8: {
		u32 *dest = (u32 *)(Data + (y * Pitch) + (x << 2));
		*dest = blend ? PixelBlend32(*dest, color.color) : color.color;
	} break;

	case ECF_UNKNOWN:
		os::Printer::log("IImage::setPixel unknown format.", ELL_WARNING);
		return;

	default:
		break;
	}
}